

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral_enumeration_file.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  istream *piVar2;
  ostream *poVar3;
  pair<kitty::static_truth_table<4U,_true>,_bool> pVar4;
  string line;
  truth_table tt;
  truth_table_set classes;
  ifstream in;
  uint64_t local_370;
  string local_368;
  static_truth_table<4U,_true> local_348;
  _Hashtable<kitty::static_truth_table<4U,_true>,_kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Identity,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_340;
  miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> local_308;
  long local_238 [65];
  
  local_340._M_buckets = &local_340._M_single_bucket;
  local_340._M_bucket_count = 1;
  local_340._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_340._M_element_count = 0;
  local_340._M_rehash_policy._M_max_load_factor = 1.0;
  local_340._M_rehash_policy._M_next_resize = 0;
  local_340._M_single_bucket = (__node_base_ptr)0x0;
  local_348._bits = 0;
  std::ifstream::ifstream(local_238,argv[1],_S_in);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  local_368._M_string_length = 0;
  local_368.field_2._M_local_buf[0] = '\0';
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_368,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    kitty::create_from_hex_string<kitty::static_truth_table<4u,true>>(&local_348,&local_368);
    kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::
    miller_spectral_canonization_impl(&local_308,&local_348,true,true,true);
    pVar4 = kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4u,true>>::
            run<void(&)(std::vector<kitty::detail::spectral_operation,std::allocator<kitty::detail::spectral_operation>>const&)>
                      ((miller_spectral_canonization_impl<kitty::static_truth_table<4u,true>> *)
                       &local_308,kitty::detail::exact_spectral_canonization_null_callback);
    kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::
    ~miller_spectral_canonization_impl(&local_308);
    local_370 = pVar4.first._bits._bits;
    local_308.func = (static_truth_table<4U,_true> *)&local_340;
    std::
    _Hashtable<kitty::static_truth_table<4u,true>,kitty::static_truth_table<4u,true>,std::allocator<kitty::static_truth_table<4u,true>>,std::__detail::_Identity,std::equal_to<kitty::static_truth_table<4u,true>>,kitty::hash<kitty::static_truth_table<4u,true>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<kitty::static_truth_table<4u,true>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<kitty::static_truth_table<4u,true>,true>>>>
              ((_Hashtable<kitty::static_truth_table<4u,true>,kitty::static_truth_table<4u,true>,std::allocator<kitty::static_truth_table<4u,true>>,std::__detail::_Identity,std::equal_to<kitty::static_truth_table<4u,true>>,kitty::hash<kitty::static_truth_table<4u,true>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&local_340,&local_370,&local_308);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[i] enumerated ",0xf);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," functions into ",0x10);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," classes.",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,
                    CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                             local_368.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_238);
  std::
  _Hashtable<kitty::static_truth_table<4U,_true>,_kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Identity,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_340);
  return 0;
}

Assistant:

int main( int argc, char ** argv )
{
  (void)argc;

  static_assert( num_vars <= 5, "number of variables is limited to 5" );

  /* truth table type in this example */
  using truth_table = kitty::static_truth_table<num_vars>;

  /* set to store all NPN and spectral representatives */
  using truth_table_set = std::unordered_set<truth_table, kitty::hash<truth_table>>;
  truth_table_set classes;

  truth_table tt;
  auto ctr = 0u;

  std::ifstream in( argv[1] );

  std::string line;
  while ( std::getline( in, line ) )
  {
    create_from_hex_string( tt, line );
    classes.insert( kitty::exact_spectral_canonization( tt ) );

    ++ctr;
  }

  std::cout << "[i] enumerated "
            << ctr << " functions into "
            << classes.size() << " classes." << std::endl;

  return 0;
}